

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FixVariablePS::FixVariablePS
          (FixVariablePS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *simplifier,int _j,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,shared_ptr<soplex::Tolerances> *tols,bool correctIdx)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  long lVar1;
  cpp_dec_float<200U,_int,_void> *pcVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  byte bVar4;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_148;
  cpp_dec_float<200U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  
  bVar4 = 0;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_148,&tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  PostStep::PostStep(&this->super_PostStep,"FixVariable",
                     (shared_ptr<soplex::Tolerances> *)&local_148,
                     (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum,
                     (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FixVariablePS_005471e8;
  this->m_j = _j;
  this->m_old_j =
       (lp->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (&(this->m_val).m_backend,&val->m_backend);
  this_00 = &this->m_obj;
  if (lp->thesense == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(this_00,lp,_j);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_138,lp,_j);
    pcVar2 = &local_138;
    pnVar3 = this_00;
    for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
      (pnVar3->m_backend).data._M_elems[0] = (pcVar2->data)._M_elems[0];
      pcVar2 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar2 + ((ulong)bVar4 * -2 + 1) * 4);
      pnVar3 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar3 + (ulong)bVar4 * -8 + 4);
    }
    (this->m_obj).m_backend.exp = local_138.exp;
    (this->m_obj).m_backend.neg = local_138.neg;
    (this->m_obj).m_backend.fpclass = local_138.fpclass;
    (this->m_obj).m_backend.prec_elem = local_138.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate(&this_00->m_backend);
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (&(this->m_lower).m_backend,
             &(lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).low.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[_j].m_backend);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (&(this->m_upper).m_backend,
             &(lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).up.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[_j].m_backend);
  this->m_correctIdx = correctIdx;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->m_col,
             (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)((lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem +
                (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[_j].idx));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)&local_138,lp,this->m_j);
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 0x1c;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems[8] = 0;
  result_1.m_backend.data._M_elems[9] = 0;
  result_1.m_backend.data._M_elems[10] = 0;
  result_1.m_backend.data._M_elems[0xb] = 0;
  result_1.m_backend.data._M_elems[0xc] = 0;
  result_1.m_backend.data._M_elems[0xd] = 0;
  result_1.m_backend.data._M_elems[0xe] = 0;
  result_1.m_backend.data._M_elems[0xf] = 0;
  result_1.m_backend.data._M_elems[0x10] = 0;
  result_1.m_backend.data._M_elems[0x11] = 0;
  result_1.m_backend.data._M_elems[0x12] = 0;
  result_1.m_backend.data._M_elems[0x13] = 0;
  result_1.m_backend.data._M_elems[0x14] = 0;
  result_1.m_backend.data._M_elems[0x15] = 0;
  result_1.m_backend.data._M_elems[0x16] = 0;
  result_1.m_backend.data._M_elems[0x17] = 0;
  result_1.m_backend.data._M_elems[0x18] = 0;
  result_1.m_backend.data._M_elems[0x19] = 0;
  result_1.m_backend.data._M_elems._104_5_ = 0;
  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_1.m_backend,&(this->m_val).m_backend,&local_138);
  (*(simplifier->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxSimplifier[0x11])(simplifier,&result_1);
  return;
}

Assistant:

FixVariablePS(const SPxLPBase<R>& lp, SPxMainSM& simplifier, int _j, const R val,
                    std::shared_ptr<Tolerances> tols, bool correctIdx = true)
         : PostStep("FixVariable", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_old_j(lp.nCols() - 1)
         , m_val(val)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_lower(lp.lower(_j))
         , m_upper(lp.upper(_j))
         , m_correctIdx(correctIdx)
         , m_col(lp.colVector(_j))
      {
         simplifier.addObjoffset(m_val * lp.obj(m_j));
      }